

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglTestPackage.cpp
# Opt level: O2

int __thiscall deqp::egl::TestPackage::init(TestPackage *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  int iVar1;
  int extraout_EAX;
  EglTestContext *this_00;
  undefined4 extraout_var;
  NativeDisplayFactory *displayFactory;
  TestNode *pTVar2;
  
  this_00 = (EglTestContext *)operator_new(0x60);
  testCtx = (this->super_TestPackage).super_TestNode.m_testCtx;
  iVar1 = (*testCtx->m_platform->_vptr_Platform[4])();
  displayFactory =
       eglu::selectNativeDisplayFactory
                 ((NativeDisplayFactoryRegistry *)(CONCAT44(extraout_var,iVar1) + 8),
                  testCtx->m_cmdLine);
  EglTestContext::EglTestContext(this_00,testCtx,displayFactory);
  this->m_eglTestCtx = this_00;
  pTVar2 = (TestNode *)operator_new(0x78);
  InfoTests::InfoTests((InfoTests *)pTVar2,this_00);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  FunctionalTests::FunctionalTests((FunctionalTests *)pTVar2,this->m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  PerformanceTests::PerformanceTests((PerformanceTests *)pTVar2,this->m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  StressTests::StressTests((StressTests *)pTVar2,this->m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void TestPackage::init (void)
{
	DE_ASSERT(!m_eglTestCtx);
	m_eglTestCtx = new EglTestContext(m_testCtx, getDefaultDisplayFactory(m_testCtx));

	try
	{
		addChild(new InfoTests			(*m_eglTestCtx));
		addChild(new FunctionalTests	(*m_eglTestCtx));
		addChild(new PerformanceTests	(*m_eglTestCtx));
		addChild(new StressTests		(*m_eglTestCtx));
	}
	catch (...)
	{
		delete m_eglTestCtx;
		m_eglTestCtx = DE_NULL;

		throw;
	}
}